

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest17::FunctionalTest17
          (FunctionalTest17 *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,
             "same_subroutine_and_subroutine_uniform_but_different_type_used_in_all_stages",
             "Creates a program which uses the same subroutine and subroutine uniform names for every stage (types of subroutines are different in each stage) and then makes sure that such program compiles and works as expected."
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dca6e0;
  this->m_fbo_id = 0;
  this->m_fs_id = 0;
  this->m_gs_id = 0;
  this->m_has_test_passed = true;
  this->m_po_id = 0;
  this->m_tc_id = 0;
  this->m_te_id = 0;
  this->m_to_data = (float *)0x0;
  this->m_to_height = 4;
  this->m_to_id = 0;
  this->m_to_width = 4;
  this->m_vao_id = 0;
  this->m_vs_id = 0;
  return;
}

Assistant:

FunctionalTest17::FunctionalTest17(deqp::Context& context)
	: TestCase(context, "same_subroutine_and_subroutine_uniform_but_different_type_used_in_all_stages",
			   "Creates a program which uses the same subroutine and subroutine uniform "
			   "names for every stage (types of subroutines are different in each stage) "
			   "and then makes sure that such program compiles and works as expected.")
	, m_fbo_id(0)
	, m_fs_id(0)
	, m_gs_id(0)
	, m_has_test_passed(true)
	, m_po_id(0)
	, m_tc_id(0)
	, m_te_id(0)
	, m_to_data(DE_NULL)
	, m_to_height(4) /* arbitrary value */
	, m_to_id(0)
	, m_to_width(4) /* arbitrary value */
	, m_vao_id(0)
	, m_vs_id(0)
{
	/* Left blank intentionally */
}